

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey-C-API.cpp
# Opt level: O2

void llb_build_key_get_custom_task_data(llb_build_key_t *key,llb_data_t *out_task_data)

{
  uint8_t *puVar1;
  StringRef data;
  StringRef local_40;
  string local_30;
  
  local_40 = llbuild::buildsystem::BuildKey::getCustomTaskData((BuildKey *)(key + 0x10));
  out_task_data->length = local_40.Length;
  llvm::StringRef::str_abi_cxx11_(&local_30,&local_40);
  puVar1 = (uint8_t *)strdup(local_30._M_dataplus._M_p);
  out_task_data->data = puVar1;
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void llb_build_key_get_custom_task_data(llb_build_key_t *key, llb_data_t *out_task_data) {
  auto data = ((CAPIBuildKey *)key)->getInternalBuildKey().getCustomTaskData();
  out_task_data->length = data.size();
  out_task_data->data = (const uint8_t*)strdup(data.str().c_str());
}